

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

ParserResult * __thiscall
Catch::clara::detail::
BoundLambda<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/tomjnixon[P]actorpp/submodules/catch2/catch.hpp:9708:33)>
::setValue(ParserResult *__return_storage_ptr__,
          BoundLambda<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_tomjnixon[P]actorpp_submodules_catch2_catch_hpp:9708:33)>
          *this,string *arg)

{
  What *pWVar1;
  What WVar2;
  bool bVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> temp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  BasicResult<Catch::clara::detail::ParseResultType> local_48;
  
  temp._M_dataplus._M_p = (pointer)&temp.field_2;
  temp._M_string_length = 0;
  temp.field_2._M_local_buf[0] = '\0';
  ::std::__cxx11::string::_M_assign((string *)&temp);
  local_48.m_errorMessage._M_dataplus._M_p = (pointer)&local_48.m_errorMessage.field_2;
  local_48.super_ResultValueBase<Catch::clara::detail::ParseResultType>.super_ResultBase.m_type = Ok
  ;
  local_48.super_ResultValueBase<Catch::clara::detail::ParseResultType>.super_ResultBase._12_4_ = 0;
  local_48.super_ResultValueBase<Catch::clara::detail::ParseResultType>.super_ResultBase.
  _vptr_ResultBase = (_func_int **)&PTR__BasicResult_0017da30;
  local_48.m_errorMessage._M_string_length = 0;
  local_48.m_errorMessage.field_2._M_local_buf[0] = '\0';
  bVar3 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &temp,"NoAssertions");
  if (bVar3) {
    WVar2 = NoAssertions;
  }
  else {
    bVar3 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &temp,"NoTests");
    if (!bVar3) {
      ::std::operator+(&local_88,"Unrecognised warning: \'",&temp);
      ::std::operator+(&local_68,&local_88,"\'");
      BasicResult<Catch::clara::detail::ParseResultType>::runtimeError
                (__return_storage_ptr__,&local_68);
      ::std::__cxx11::string::~string((string *)&local_68);
      ::std::__cxx11::string::~string((string *)&local_88);
      goto LAB_0012aad0;
    }
    WVar2 = NoTests;
  }
  pWVar1 = &((this->m_lambda).config)->warnings;
  *pWVar1 = *pWVar1 | WVar2;
  *(undefined8 *)
   &(__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseResultType>).
    super_ResultBase.m_type = 0;
  (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseResultType>).
  super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__BasicResult_0017da30;
  (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
  (__return_storage_ptr__->m_errorMessage)._M_string_length = 0;
  (__return_storage_ptr__->m_errorMessage).field_2._M_local_buf[0] = '\0';
LAB_0012aad0:
  BasicResult<Catch::clara::detail::ParseResultType>::~BasicResult(&local_48);
  ::std::__cxx11::string::~string((string *)&temp);
  return __return_storage_ptr__;
}

Assistant:

auto setValue( std::string const &arg ) -> ParserResult override {
            return invokeLambda<typename UnaryLambdaTraits<L>::ArgType>( m_lambda, arg );
        }